

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O0

void __thiscall NameServer::loadMeta(NameServer *this)

{
  byte bVar1;
  string local_c68 [8];
  string currenetId;
  istream local_c48 [8];
  ifstream currentId_meta;
  undefined1 local_a40 [8];
  text_iarchive block_server_ov;
  ifstream block_server_meta;
  undefined1 local_7b8 [8];
  text_iarchive file_len_ov;
  ifstream file_len_meta;
  undefined1 local_530 [8];
  text_iarchive file_block_ov;
  ifstream file_block_meta;
  undefined1 local_2a8 [8];
  text_iarchive id_file_ov;
  long local_218;
  ifstream id_file_meta;
  NameServer *this_local;
  
  std::ifstream::ifstream(&local_218,"dfsfiles/namenode/id-logicpath-meta",_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  id_file_ov._120_1_ = (bVar1 & 1) != 0;
  if (!(bool)id_file_ov._120_1_) {
    boost::archive::text_iarchive::text_iarchive((text_iarchive *)local_2a8,(istream *)&local_218,0)
    ;
    boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
              ((interface_iarchive<boost::archive::text_iarchive> *)local_2a8,
               &fileid_path_lenMap_abi_cxx11_);
    std::ifstream::close();
    std::ifstream::ifstream
              (&file_block_ov.field_0x78,"dfsfiles/namenode/logicpath-blocks-meta",_S_in);
    boost::archive::text_iarchive::text_iarchive
              ((text_iarchive *)local_530,(istream *)&file_block_ov.field_0x78,0);
    boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
              ((interface_iarchive<boost::archive::text_iarchive> *)local_530,
               &logicFile_BlockFileMap_abi_cxx11_);
    std::ifstream::close();
    std::ifstream::ifstream(&file_len_ov.field_0x78,"dfsfiles/namenode/logicpath-len-meta",_S_in);
    boost::archive::text_iarchive::text_iarchive
              ((text_iarchive *)local_7b8,(istream *)&file_len_ov.field_0x78,0);
    boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
              ((interface_iarchive<boost::archive::text_iarchive> *)local_7b8,
               &path_lenMap_abi_cxx11_);
    std::ifstream::close();
    std::ifstream::ifstream
              (&block_server_ov.field_0x78,"dfsfiles/namenode/block-servers-meta",_S_in);
    boost::archive::text_iarchive::text_iarchive
              ((text_iarchive *)local_a40,(istream *)&block_server_ov.field_0x78,0);
    boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
              ((interface_iarchive<boost::archive::text_iarchive> *)local_a40,
               &block_serversMap_abi_cxx11_);
    std::ifstream::close();
    std::ifstream::ifstream(local_c48,"dfsfiles/namenode/current-id-meta",_S_in);
    std::__cxx11::string::string(local_c68);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_c48,local_c68);
    fileID = std::__cxx11::stoi((string *)local_c68,(size_t *)0x0,10);
    std::ifstream::close();
    std::__cxx11::string::~string(local_c68);
    std::ifstream::~ifstream(local_c48);
    boost::archive::text_iarchive::~text_iarchive((text_iarchive *)local_a40);
    std::ifstream::~ifstream(&block_server_ov.field_0x78);
    boost::archive::text_iarchive::~text_iarchive((text_iarchive *)local_7b8);
    std::ifstream::~ifstream(&file_len_ov.field_0x78);
    boost::archive::text_iarchive::~text_iarchive((text_iarchive *)local_530);
    std::ifstream::~ifstream(&file_block_ov.field_0x78);
    boost::archive::text_iarchive::~text_iarchive((text_iarchive *)local_2a8);
  }
  id_file_ov._121_3_ = 0;
  std::ifstream::~ifstream(&local_218);
  return;
}

Assistant:

void loadMeta() const
    {
        ifstream id_file_meta("dfsfiles/namenode/id-logicpath-meta");
        if(!id_file_meta)
        {
            return;
        }
        boost::archive::text_iarchive id_file_ov(id_file_meta);
        id_file_ov >> fileid_path_lenMap;
        id_file_meta.close();

        ifstream file_block_meta("dfsfiles/namenode/logicpath-blocks-meta");
        boost::archive::text_iarchive file_block_ov(file_block_meta);
        file_block_ov >> logicFile_BlockFileMap;
        file_block_meta.close();

        ifstream file_len_meta("dfsfiles/namenode/logicpath-len-meta");
        boost::archive::text_iarchive file_len_ov(file_len_meta);
        file_len_ov >> path_lenMap;
        file_len_meta.close();

        ifstream block_server_meta("dfsfiles/namenode/block-servers-meta");
        boost::archive::text_iarchive block_server_ov(block_server_meta);
        block_server_ov >> block_serversMap;
        block_server_meta.close();

        ifstream currentId_meta("dfsfiles/namenode/current-id-meta");
        string currenetId;
        getline(currentId_meta, currenetId);
        fileID = stoi(currenetId);
        currentId_meta.close();

    }